

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  basic_string_view<char> value;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  format_args args_00;
  handle h;
  basic_string_view<char> fmt_00;
  bool bVar1;
  size_t sVar2;
  char *lhs;
  unsigned_long_long in_RCX;
  size_t in_RDX;
  char *in_RSI;
  buffer<char> *in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R8;
  void *in_R9;
  appender out;
  unkbyte10 in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe32;
  char *in_stack_fffffffffffffe38;
  float value_02;
  default_arg_formatter<char> *pdVar3;
  default_arg_formatter<char> *in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe48;
  undefined2 uVar4;
  undefined2 uVar5;
  int in_stack_fffffffffffffe4c;
  undefined4 uVar6;
  basic_format_args<fmt::v11::context> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined7 uVar7;
  undefined1 in_stack_fffffffffffffe5f;
  undefined1 uVar8;
  custom_value<fmt::v11::context> *this;
  default_arg_formatter<char> *in_stack_fffffffffffffe90;
  void *in_stack_fffffffffffffe98;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *in_stack_fffffffffffffea0;
  parse_context<char> local_158;
  context cStack_140;
  char *local_120;
  size_t local_118;
  default_arg_formatter<char> local_110 [2];
  format_handler<char> *in_stack_ffffffffffffff00;
  basic_string_view<char> in_stack_ffffffffffffff08;
  basic_appender<char> local_e8 [2];
  locale_ref local_d8;
  unsigned_long_long local_d0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  basic_string_view<char> local_c0;
  monostate local_a9;
  void *local_a8;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_a0;
  handle local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  uint128_opt *local_58;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_50;
  int128_opt *local_48;
  int128_opt *local_38;
  int128_opt *local_28;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_20;
  default_arg_formatter<char> *local_10;
  custom_value<fmt::v11::context> *local_8;
  
  local_d8.locale_ = in_R9;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0.data_ = in_RSI;
  local_c0.size_ = in_RDX;
  basic_appender<char>::basic_appender(local_e8,in_RDI);
  sVar2 = basic_string_view<char>::size(&local_c0);
  if (sVar2 == 2) {
    lhs = basic_string_view<char>::data(&local_c0);
    bVar1 = equal2(lhs,"{}");
    if (bVar1) {
      this = (custom_value<fmt::v11::context> *)(local_110 + 1);
      basic_format_args<fmt::v11::context>::get(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c)
      ;
      local_110[0].out.container = (basic_appender<char>)(basic_appender<char>)local_e8[0].container
      ;
      pdVar3 = local_110;
      value_02 = (float)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      local_10 = pdVar3;
      local_8 = this;
      switch(*(undefined4 *)&this[1].value) {
      case 0:
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>(in_stack_fffffffffffffe40,(int)value_02);
        return;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>
                  (in_stack_fffffffffffffe40,(uint)value_02);
        return;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  (in_stack_fffffffffffffe40,(longlong)in_stack_fffffffffffffe38);
        return;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  (in_stack_fffffffffffffe40,(unsigned_long_long)in_stack_fffffffffffffe38);
        return;
      case 5:
        uVar7 = SUB87(pdVar3,0);
        uVar8 = (undefined1)((ulong)pdVar3 >> 0x38);
        local_28 = (int128_opt *)this->value;
        local_20 = this->format;
        x._10_6_ = in_stack_fffffffffffffe32;
        x._0_10_ = in_stack_fffffffffffffe28;
        local_48 = map(local_28,(int128_opt)x);
        value_00._8_7_ = uVar7;
        value_00._0_8_ = in_stack_fffffffffffffe50;
        value_00[0xf] = uVar8;
        local_38 = local_48;
        default_arg_formatter<char>::operator()<__int128,_0>
                  ((default_arg_formatter<char> *)this,(__int128)value_00);
        return;
      case 6:
        local_58 = (uint128_opt *)this->value;
        local_50 = this->format;
        x_00._10_6_ = in_stack_fffffffffffffe32;
        x_00._0_10_ = in_stack_fffffffffffffe28;
        local_78 = map(local_58,(uint128_opt)x_00);
        value_01._8_7_ = in_stack_fffffffffffffe58;
        value_01._0_8_ = pdVar3;
        value_01[0xf] = in_stack_fffffffffffffe5f;
        local_68 = local_78;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  ((default_arg_formatter<char> *)this,(unsigned___int128)value_01);
        return;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>
                  ((default_arg_formatter<char> *)this,(bool)in_stack_fffffffffffffe5f);
        return;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>
                  (in_stack_fffffffffffffe40,(char)((ulong)in_stack_fffffffffffffe38 >> 0x38));
        return;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>(in_stack_fffffffffffffe40,value_02);
        return;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  (in_stack_fffffffffffffe40,(double)in_stack_fffffffffffffe38);
        return;
      case 0xb:
        default_arg_formatter<char>::operator()<long_double,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffe50,
                   (longdouble)CONCAT28(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40));
        return;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        return;
      case 0xd:
        uVar4 = SUB82(pdVar3,0);
        uVar5 = (undefined2)((ulong)pdVar3 >> 0x10);
        uVar6 = (undefined4)((ulong)pdVar3 >> 0x20);
        local_88 = string_value<char>::str((string_value<char> *)0x700af7);
        value.data_._2_2_ = uVar5;
        value.data_._0_2_ = uVar4;
        value.data_._4_4_ = uVar6;
        value.size_ = (size_t)in_stack_fffffffffffffe50;
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  (in_stack_fffffffffffffe40,value);
        return;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  ((default_arg_formatter<char> *)this,
                   (void *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        return;
      case 0xf:
        local_a8 = this->value;
        local_a0 = this->format;
        basic_format_arg<fmt::v11::context>::handle::handle(&local_98,*this);
        h.custom_.format = in_stack_fffffffffffffea0;
        h.custom_.value = in_stack_fffffffffffffe98;
        default_arg_formatter<char>::operator()(in_stack_fffffffffffffe90,h);
        return;
      }
      monostate::monostate(&local_a9);
      default_arg_formatter<char>::operator()(pdVar3);
      return;
    }
  }
  local_120 = local_c0.data_;
  local_118 = local_c0.size_;
  fmt_00.size_ = local_c0.size_;
  fmt_00.data_ = local_c0.data_;
  parse_context<char>::parse_context(&local_158,fmt_00,0);
  args_00.field_1.args_ = local_c8.args_;
  args_00.desc_ = local_d0;
  v11::context::context(&cStack_140,(iterator)local_e8[0].container,args_00,local_d8);
  parse_format_string<char,fmt::v11::detail::format_handler<char>>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}